

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Bool prvTidyXMLPreserveWhiteSpace(TidyDocImpl *doc,Node *element)

{
  int iVar1;
  uint uVar2;
  Bool BVar3;
  AttVal *pAVar4;
  Parser *pPVar5;
  
  pAVar4 = (AttVal *)&element->attributes;
  do {
    pAVar4 = pAVar4->next;
    if (pAVar4 == (AttVal *)0x0) {
      if (element->element == (tmbstr)0x0) goto LAB_0013c6e9;
      if ((((element->tag == (Dict *)0x0) || (uVar2 = element->tag->id - TidyTag_PRE, 0x13 < uVar2))
          || ((0x80401U >> (uVar2 & 0x1f) & 1) == 0)) &&
         (pPVar5 = prvTidyFindParser(doc,element), pPVar5 != prvTidyParsePre)) {
        iVar1 = prvTidytmbstrcasecmp(element->element,"xsl:text");
        return (uint)(iVar1 == 0);
      }
      goto LAB_0013c6ed;
    }
  } while ((pAVar4->dict == (Attribute *)0x0) || (pAVar4->dict->id != TidyAttr_XML_SPACE));
  if ((pAVar4->value == (ctmbstr)0x0) ||
     (iVar1 = prvTidytmbstrcasecmp(pAVar4->value,"preserve"), iVar1 != 0)) {
LAB_0013c6e9:
    BVar3 = no;
  }
  else {
LAB_0013c6ed:
    BVar3 = yes;
  }
  return BVar3;
}

Assistant:

Bool TY_(XMLPreserveWhiteSpace)( TidyDocImpl* doc, Node *element)
{
    AttVal *attribute;

    /* search attributes for xml:space */
    for (attribute = element->attributes; attribute; attribute = attribute->next)
    {
        if (attrIsXML_SPACE(attribute))
        {
            if (AttrValueIs(attribute, "preserve"))
                return yes;

            return no;
        }
    }

    if (element->element == NULL)
        return no;
        
    /* kludge for html docs without explicit xml:space attribute */
    if (nodeIsPRE(element)    ||
        nodeIsSCRIPT(element) ||
        nodeIsSTYLE(element)  ||
        TY_(FindParser)(doc, element) == TY_(ParsePre))
        return yes;

    /* kludge for XSL docs */
    if ( TY_(tmbstrcasecmp)(element->element, "xsl:text") == 0 )
        return yes;

    return no;
}